

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::java::anon_unknown_0::GenerateGetBitInternal
                   (string *__return_storage_ptr__,string *prefix,int bitIndex)

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *psVar3;
  size_type *psVar4;
  long *plVar5;
  int iVar6;
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  long local_a0;
  long lStack_98;
  undefined1 local_90 [8];
  string varName;
  long local_60;
  long lStack_58;
  undefined1 local_50 [8];
  string mask;
  
  iVar6 = bitIndex + 0x1f;
  if (-1 < bitIndex) {
    iVar6 = bitIndex;
  }
  GetBitFieldName_abi_cxx11_((string *)local_50,(java *)(ulong)(uint)(iVar6 >> 5),bitIndex);
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)local_50,0,(char *)0x0,(ulong)(prefix->_M_dataplus)._M_p);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    varName._M_string_length = *psVar4;
    varName.field_2._M_allocated_capacity = plVar2[3];
    local_90 = (undefined1  [8])&varName._M_string_length;
  }
  else {
    varName._M_string_length = *psVar4;
    local_90 = (undefined1  [8])*plVar2;
  }
  varName._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_50 != (undefined1  [8])&mask._M_string_length) {
    operator_delete((void *)local_50);
  }
  std::__cxx11::string::string
            ((string *)local_50,*(char **)(bit_masks + (long)(bitIndex % 0x20) * 8),
             (allocator *)(varName.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,"((",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  plVar2 = (long *)std::__cxx11::string::append(local_d0);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar2[3];
    local_b0._M_allocated_capacity = (size_type)&local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0._M_allocated_capacity = (size_type)(long *)*plVar2;
  }
  local_b0._8_8_ = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append(local_b0._M_local_buf,(ulong)local_50);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar2[3];
    varName.field_2._8_8_ = &local_60;
  }
  else {
    local_60 = *plVar5;
    varName.field_2._8_8_ = (long *)*plVar2;
  }
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append(varName.field_2._M_local_buf + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((long *)varName.field_2._8_8_ != &local_60) {
    operator_delete((void *)varName.field_2._8_8_);
  }
  if ((long *)local_b0._M_allocated_capacity != &local_a0) {
    operator_delete((void *)local_b0._M_allocated_capacity);
  }
  psVar3 = (string *)(local_d0 + 0x10);
  if ((string *)local_d0._0_8_ != psVar3) {
    operator_delete((void *)local_d0._0_8_);
    psVar3 = extraout_RAX;
  }
  if (local_50 != (undefined1  [8])&mask._M_string_length) {
    operator_delete((void *)local_50);
    psVar3 = extraout_RAX_00;
  }
  if (local_90 != (undefined1  [8])&varName._M_string_length) {
    operator_delete((void *)local_90);
    psVar3 = extraout_RAX_01;
  }
  return psVar3;
}

Assistant:

std::string GenerateGetBitInternal(const std::string& prefix, int bitIndex) {
  std::string varName = prefix + GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  std::string mask = bit_masks[bitInVarIndex];
  std::string result = "((" + varName + " & " + mask + ") != 0)";
  return result;
}